

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O3

t_int * sigrzero_perform(t_int *w)

{
  long lVar1;
  t_int tVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  lVar1 = w[4];
  tVar2 = w[5];
  fVar8 = *(float *)(lVar1 + 0x34);
  if (0 < (int)tVar2) {
    lVar3 = w[3];
    lVar4 = w[1];
    lVar5 = w[2];
    lVar6 = 0;
    fVar7 = fVar8;
    do {
      fVar8 = *(float *)(lVar4 + lVar6 * 4);
      *(float *)(lVar3 + lVar6 * 4) = fVar8 - fVar7 * *(float *)(lVar5 + lVar6 * 4);
      lVar6 = lVar6 + 1;
      fVar7 = fVar8;
    } while ((int)tVar2 != (int)lVar6);
  }
  *(float *)(lVar1 + 0x34) = fVar8;
  return w + 6;
}

Assistant:

static t_int *sigrzero_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    t_sigrzero *x = (t_sigrzero *)(w[4]);
    int n = (int)w[5];
    int i;
    t_sample last = x->x_last;
    for (i = 0; i < n; i++)
    {
        t_sample next = *in1++;
        t_sample coef = *in2++;
        *out++ = next - coef * last;
        last = next;
    }
    x->x_last = last;
    return (w+6);
}